

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O3

JsErrorCode JsDiagStopDebugging(JsRuntimeHandle runtimeHandle,void **callbackState)

{
  ThreadContext *threadContext;
  ScriptContext *this;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  HRESULT hr;
  JsrtDebugManager *this_00;
  undefined4 *puVar4;
  void *pvVar5;
  JsErrorCode JVar6;
  JsrtRuntime *runtime;
  AutoNestedHandledExceptionType local_68 [2];
  TTDebuggerAbortException anon_var_0;
  ThreadContextScope local_40;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar6 = JsErrorInvalidArgument;
  }
  else {
    if (callbackState != (void **)0x0) {
      *callbackState = (void *)0x0;
    }
    ThreadContext::ValidateThreadContext(*runtimeHandle);
    threadContext = *runtimeHandle;
    if (threadContext->recycler != (Recycler *)0x0) {
      bVar2 = Memory::Recycler::IsHeapEnumInProgress(threadContext->recycler);
      JVar6 = JsErrorHeapEnumInProgress;
      if (bVar2) goto LAB_003b01e5;
    }
    JVar6 = JsErrorInThreadServiceCallback;
    if (((threadContext->threadService).isInCallback != false) ||
       (JVar6 = JsErrorRuntimeInUse, threadContext->callRootLevel != 0)) goto LAB_003b01e5;
    ThreadContextScope::ThreadContextScope(&local_40,threadContext);
    JVar6 = JsErrorWrongThread;
    if (local_40.isValid == true) {
      this_00 = JsrtRuntime::GetJsrtDebugManager((JsrtRuntime *)runtimeHandle);
      JVar6 = JsErrorDiagNotInDebugMode;
      if (this_00 != (JsrtDebugManager *)0x0) {
        bVar2 = JsrtDebugManager::IsDebugEventCallbackSet(this_00);
        if (bVar2) {
          this = *(ScriptContext **)(*runtimeHandle + 0x10e0);
          if (this != (ScriptContext *)0x0) {
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            iVar3 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this);
            if ((char)iVar3 == '\0') {
              bVar2 = Js::ScriptContext::IsScriptContextInDebugMode(this);
              if (!bVar2) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar4 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDiag.cpp"
                                   ,0x91,"(scriptContext->IsScriptContextInDebugMode())",
                                   "scriptContext->IsScriptContextInDebugMode()");
                if (!bVar2) goto LAB_003b0394;
                *puVar4 = 0;
              }
              hr = Js::ScriptContext::OnDebuggerDetached(this);
              if (-1 < hr) {
                Js::ScriptContext::GetDebugContext(this);
              }
              Debugger_AttachDetach_unrecoverable_error(hr);
              ThreadContextScope::~ThreadContextScope(&local_40);
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar4 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                                 ,0x89,
                                 "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                                 ,
                                 "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                                );
              if (!bVar2) {
LAB_003b0394:
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              *puVar4 = 0;
              JVar6 = JsErrorFatal;
              goto LAB_003b01e5;
            }
          }
          pvVar5 = JsrtDebugManager::GetAndClearCallbackState(this_00);
          JVar6 = JsNoError;
          if (callbackState != (void **)0x0) {
            *callbackState = pvVar5;
            JVar6 = JsNoError;
          }
        }
      }
    }
    ThreadContextScope::~ThreadContextScope(&local_40);
  }
LAB_003b01e5:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
  return JVar6;
}

Assistant:

CHAKRA_API JsDiagStopDebugging(
    _In_ JsRuntimeHandle runtimeHandle,
    _Out_opt_ void** callbackState)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {

        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        if (callbackState != nullptr)
        {
            *callbackState = nullptr;
        }

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
        ThreadContext * threadContext = runtime->GetThreadContext();

        VALIDATE_RUNTIME_STATE_FOR_START_STOP_DEBUGGING(threadContext);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        for (Js::ScriptContext *scriptContext = runtime->GetThreadContext()->GetScriptContextList();
        scriptContext != nullptr && !scriptContext->IsClosed();
            scriptContext = scriptContext->next)
        {
            Assert(scriptContext->IsScriptContextInDebugMode());

            HRESULT hr;
            if (FAILED(hr = scriptContext->OnDebuggerDetached()))
            {
                Debugger_AttachDetach_unrecoverable_error(hr); // Inconsistent state, we can't continue from here
                return JsErrorFatal;
            }

            Js::DebugContext* debugContext = scriptContext->GetDebugContext();

            Js::ProbeContainer* probeContainer = debugContext->GetProbeContainer();
            probeContainer->UninstallInlineBreakpointProbe(nullptr);
            probeContainer->UninstallDebuggerScriptOptionCallback();

            jsrtDebugManager->ClearBreakpointDebugDocumentDictionary();
        }

        void* cbState = jsrtDebugManager->GetAndClearCallbackState();

        if (callbackState != nullptr)
        {
            *callbackState = cbState;
        }

        return JsNoError;
    });
#endif
}